

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

bool __thiscall QWizard::event(QWizard *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  QWizardPrivate *this_00;
  QEvent *in_RSI;
  QStyle *in_RDI;
  QWizardPrivate *d;
  QWizardPrivate *in_stack_00000040;
  QEvent *in_stack_00000128;
  QWidget *in_stack_00000130;
  QWizardPrivate *in_stack_ffffffffffffffd8;
  
  this_00 = d_func((QWizard *)0x7bc651);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == StyleChange) {
    QWidget::style((QWidget *)this_00);
    QWizardPrivate::setStyle(this_00,in_RDI);
    QWizardPrivate::updateLayout(in_stack_00000040);
  }
  else {
    TVar2 = QEvent::type(in_RSI);
    if (TVar2 == PaletteChange) {
      QWizardPrivate::updatePalette(in_stack_ffffffffffffffd8);
    }
  }
  bVar1 = QWidget::event(in_stack_00000130,in_stack_00000128);
  return bVar1;
}

Assistant:

bool QWizard::event(QEvent *event)
{
    Q_D(QWizard);
    if (event->type() == QEvent::StyleChange) { // Propagate style
        d->setStyle(style());
        d->updateLayout();
    } else if (event->type() == QEvent::PaletteChange) { // Emitted on theme change
        d->updatePalette();
    }
#if QT_CONFIG(style_windowsvista)
    else if (event->type() == QEvent::Show && d->vistaInitPending) {
        d->vistaInitPending = false;
        d->wizStyle = AeroStyle;
        d->handleAeroStyleChange();
    }
    else if (d->isVistaThemeEnabled()) {
        if (event->type() == QEvent::Resize
                || event->type() == QEvent::LayoutDirectionChange) {
            const int buttonLeft = (layoutDirection() == Qt::RightToLeft
                                    ? width() - d->vistaHelper->backButton()->sizeHint().width()
                                    : 0);

            d->vistaHelper->backButton()->move(buttonLeft,
                                               d->vistaHelper->backButton()->y());
        }

        d->vistaHelper->mouseEvent(event);
    }
#endif
    return QDialog::event(event);
}